

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gencode.c
# Opt level: O3

block * gen_acode(compiler_state_t *cstate,u_char *eaddr,qual q)

{
  int *piVar1;
  char cVar2;
  uint uVar3;
  code *pcVar4;
  long lVar5;
  byte bVar6;
  char cVar7;
  uint uVar8;
  uint reverse;
  compiler_state_t *pcVar9;
  block *pbVar10;
  slist *psVar11;
  block *pbVar12;
  compiler_state_t *pcVar13;
  bpf_u_int32 bVar14;
  u_int offset;
  u_int unaff_EBX;
  undefined1 *puVar15;
  int *piVar16;
  undefined1 *puVar17;
  compiler_state_t **ppcVar18;
  long unaff_RBP;
  e_offrel eVar19;
  char *pcVar20;
  uint in_R8D;
  bpf_u_int32 bVar21;
  bpf_u_int32 bVar22;
  bpf_u_int32 in_R9D;
  bpf_u_int32 jtype;
  bpf_int32 in_R10D;
  long in_R11;
  compiler_state_t *unaff_R12;
  u_int unaff_R13D;
  bpf_int32 unaff_R14D;
  compiler_state_t *unaff_R15;
  compiler_state_t *in_stack_00000008;
  compiler_state_t *pcStackY_40;
  
  ppcVar18 = (compiler_state_t **)&stack0xffffffffffffffe8;
  puVar15 = &stack0xffffffffffffffe8;
  if ((cstate->linktype != 0x81) && (cstate->linktype != 7)) {
    pcVar20 = "aid supported only on ARCnet";
    goto LAB_0011031e;
  }
  if (((uint)q & 0xfffe) != 0x100) {
    pcVar20 = "ARCnet address used in non-arc expression";
    goto LAB_0011031e;
  }
  bVar14 = (uint)q >> 0x10;
  if (10 < q.dir) {
    abort();
  }
  uVar8 = bVar14 & 0xff;
  bVar21 = 0x11fd58;
  uVar3 = (&switchD_0011021c::switchdataD_0011fd58)[uVar8];
  pcVar9 = (compiler_state_t *)((long)&switchD_0011021c::switchdataD_0011fd58 + (long)(int)uVar3);
  cVar7 = (char)pcVar9;
  reverse = (uint)pcVar9;
  eVar19 = (e_offrel)eaddr;
  switch(uVar8) {
  default:
    pbVar12 = gen_bcmp(cstate,OR_LINKHDR,0,1,eaddr);
    pbVar10 = gen_bcmp(cstate,OR_LINKHDR,1,1,eaddr);
    gen_or(pbVar12,pbVar10);
    return pbVar10;
  case 1:
    offset = 0;
    goto LAB_001102c6;
  case 2:
    offset = 1;
LAB_001102c6:
    pbVar12 = gen_bcmp(cstate,OR_LINKHDR,offset,1,eaddr);
    return pbVar12;
  case 4:
    pbVar12 = gen_bcmp(cstate,OR_LINKHDR,0,1,eaddr);
    pbVar10 = gen_bcmp(cstate,OR_LINKHDR,1,1,eaddr);
    gen_and(pbVar12,pbVar10);
    return pbVar10;
  case 5:
    pcVar20 = "\'addr1\' is only supported on 802.11";
    break;
  case 6:
    pcVar20 = "\'addr2\' is only supported on 802.11";
    break;
  case 7:
    pcVar20 = "\'addr3\' is only supported on 802.11";
    break;
  case 8:
    pcVar20 = "\'addr4\' is only supported on 802.11";
    break;
  case 9:
    pcVar20 = "\'ra\' is only supported on 802.11";
    break;
  case 10:
    pcVar20 = "\'ta\' is only supported on 802.11";
    break;
  case 0xb:
    switchD_0011021c::switchdataD_0011fd58._0_1_ = 0xc6;
    UINT_0011fce0._1_1_ = 0xf3;
    return (block *)pcVar9;
  case 0xc:
    bVar21 = 0xf;
    goto LAB_00110dae;
  case 0xd:
    pbVar12 = (block *)newchunk((compiler_state_t *)((ulong)cstate & 0xffffffff),(size_t)eaddr);
    (pbVar12->s).code = 0x15;
    pbVar12->head = pbVar12;
    pcVar9 = unaff_R15;
    do {
      pcVar13 = pcVar9;
      pcVar9 = (compiler_state_t *)pcVar13->top_ctx[0].__jmpbuf[4];
    } while (pcVar9 != (compiler_state_t *)0x0);
    pcVar13->top_ctx[0].__jmpbuf[4] = (long)unaff_R12;
    pbVar12->stmts = (slist *)unaff_R15;
    gen_and((block *)eaddr,pbVar12);
    cstate->is_geneve = 1;
    return pbVar12;
  case 0xe:
    if (pcVar9 == (compiler_state_t *)0x0) {
      bpf_error(cstate,"\'callref\' supported only on raw ATM");
    }
    bVar14 = cstate->off_proto;
    if (bVar14 == 0xffffffff) {
      abort();
    }
    bVar21 = 0xffffffff;
LAB_00110dae:
    pbVar12 = gen_ncmp(cstate,OR_LINKHDR,bVar14,0x10,bVar21,in_R9D,reverse,in_R10D);
    return pbVar12;
  case 0xf:
    UINT_0011fce0._1_1_ = 0xe7;
    pbVar12 = (block *)(*(code *)((long)&switchD_00110d26::switchdataD_0011fd84 +
                                 (long)(int)(&switchD_00110d26::switchdataD_0011fd84)[(long)eaddr]))
                                 (cstate,eaddr,
                                  (code *)((long)&switchD_00110d26::switchdataD_0011fd84 +
                                          (long)(int)(&switchD_00110d26::switchdataD_0011fd84)
                                                     [(long)eaddr]));
    return pbVar12;
  case 0x10:
    pbVar12 = (block *)((ulong)pcVar9 | 0x31);
    pbVar12->sense = (int)CONCAT71(0x11fd,pbVar12->sense == 0);
    return pbVar12;
  case 0x11:
    puVar15 = (undefined1 *)0x0;
    *(char *)pcVar9->top_ctx[0].__jmpbuf = (char)pcVar9->top_ctx[0].__jmpbuf[0] + cVar7;
    if ((1 < uVar3 + 0x11fccd) && (reverse != 0xc5)) {
      pcVar20 = "\'hfisu\' supported only on MTP2_HSL";
LAB_001110d4:
      *(code **)(puVar15 + -8) = gen_mtp3field_code;
      bpf_error(cstate,pcVar20);
    }
    bVar14 = cstate->off_li_hsl;
    bVar21 = 8;
    bVar22 = 0xff80;
    jtype = 0x10;
    uRamfffffffffffffff8 = 0;
    piVar16 = (int *)&uRamfffffffffffffff0;
    uRamfffffffffffffff0 = 0;
    goto LAB_0011108c;
  case 0x12:
    pcVar9 = (compiler_state_t *)gen_ncmp(cstate,eVar19,bVar14,0x11fd58,0xff80,0x20,1,0x100);
    puVar17 = &stack0xffffffffffffffe8;
    bVar14 = cstate->off_li_hsl;
    bVar21 = 8;
    bVar22 = 0xff80;
    goto LAB_0011102e;
  case 0x13:
    pcVar20 = (char *)((long)cstate[0x51].top_ctx[0].__saved_mask.__val + 0x6b);
    *pcVar20 = *pcVar20 + 'X';
    *(char *)(unaff_RBP + -0x8a78) = *(char *)(unaff_RBP + -0x8a78) + 'X';
    piVar1 = (int *)((long)cstate[0x411c8].top_ctx[0].__saved_mask.__val + 0x31);
    *piVar1 = *piVar1 + 1;
    if (reverse != 0xc5) {
      pcVar20 = "\'msu\' supported only on MTP2";
      goto LAB_001110d4;
    }
    bVar14 = cstate->off_li;
    bVar21 = 0x10;
    bVar22 = 0x3f;
    jtype = 0x20;
    piVar16 = (int *)&stack0xffffffffffffffd8;
LAB_0011108c:
    piVar16[-2] = 0x111091;
    piVar16[-1] = 0;
    pbVar12 = gen_ncmp(cstate,OR_PACKET,bVar14,bVar21,bVar22,jtype,*piVar16,piVar16[2]);
    return pbVar12;
  case 0x14:
    switch(uVar8) {
    default:
      UINT_0011fce0._1_1_ = 0xf3;
      switchD_0011021c::switchdataD_0011fd58._0_1_ = 0xc6;
      halt_baddata();
    case 1:
      UINT_0011fce0._1_1_ = 0xf3;
      switchD_0011021c::switchdataD_0011fd58._0_1_ = 0xc6;
      halt_baddata();
    case 2:
      UINT_0011fce0._1_1_ = 0xf3;
      switchD_0011021c::switchdataD_0011fd58._0_1_ = 0xc6;
      halt_baddata();
    case 4:
      UINT_0011fce0._1_1_ = 0xf3;
      switchD_0011021c::switchdataD_0011fd58._0_1_ = 0xc6;
      halt_baddata();
    case 5:
      UINT_0011fce0._1_1_ = 0xf3;
      switchD_0011021c::switchdataD_0011fd58._0_1_ = 0xc6;
      halt_baddata();
    case 6:
      UINT_0011fce0._1_1_ = 0xf3;
      switchD_0011021c::switchdataD_0011fd58._0_1_ = 0xc6;
      halt_baddata();
    case 7:
      UINT_0011fce0._1_1_ = 0xf3;
      switchD_0011021c::switchdataD_0011fd58._0_1_ = 0xc6;
      halt_baddata();
    case 8:
      UINT_0011fce0._1_1_ = 0xf3;
      switchD_0011021c::switchdataD_0011fd58._0_1_ = 0xc6;
      halt_baddata();
    case 9:
      UINT_0011fce0._1_1_ = 0xf3;
      switchD_0011021c::switchdataD_0011fd58._0_1_ = 0xc6;
      halt_baddata();
    case 10:
      UINT_0011fce0._1_1_ = 0xf3;
      switchD_0011021c::switchdataD_0011fd58._0_1_ = 0xc6;
      halt_baddata();
    case 0xb:
      UINT_0011fce0._1_1_ = 0xf3;
      switchD_0011021c::switchdataD_0011fd58._0_1_ = 0xc6;
      halt_baddata();
    case 0xc:
      UINT_0011fce0._1_1_ = 0xf3;
      switchD_0011021c::switchdataD_0011fd58._0_1_ = 0xc6;
      halt_baddata();
    case 0xd:
      UINT_0011fce0._1_1_ = 0xf3;
      switchD_0011021c::switchdataD_0011fd58._0_1_ = 0xc6;
      halt_baddata();
    case 0xe:
      UINT_0011fce0._1_1_ = 0xf3;
      switchD_0011021c::switchdataD_0011fd58._0_1_ = 0xc6;
      halt_baddata();
    case 0xf:
      UINT_0011fce0._1_1_ = 0xf3;
      switchD_0011021c::switchdataD_0011fd58._0_1_ = 0xc6;
      halt_baddata();
    case 0x10:
      UINT_0011fce0._1_1_ = 0xf3;
      switchD_0011021c::switchdataD_0011fd58._0_1_ = 0xc6;
      halt_baddata();
    case 0x11:
    case 0x12:
      UINT_0011fce0._1_1_ = 0xf3;
      switchD_0011021c::switchdataD_0011fd58._0_1_ = 0xc6;
      halt_baddata();
    case 0x13:
      UINT_0011fce0._1_1_ = 0xf3;
      switchD_0011021c::switchdataD_0011fd58._0_1_ = 0xc6;
      halt_baddata();
    case 0x14:
      UINT_0011fce0._1_1_ = 0xf3;
      switchD_0011021c::switchdataD_0011fd58._0_1_ = 0xc6;
      halt_baddata();
    case 0x15:
      UINT_0011fce0._1_1_ = 0xf3;
      switchD_0011021c::switchdataD_0011fd58._0_1_ = 0xc6;
      halt_baddata();
    case 0x16:
      UINT_0011fce0._1_1_ = 0xf3;
      switchD_0011021c::switchdataD_0011fd58._0_1_ = 0xc6;
      halt_baddata();
    case 0x17:
      UINT_0011fce0._1_1_ = 0xf3;
      switchD_0011021c::switchdataD_0011fd58._0_1_ = 0xc6;
      halt_baddata();
    case 0x18:
      UINT_0011fce0._1_1_ = 0xf3;
      switchD_0011021c::switchdataD_0011fd58._0_1_ = 0xc6;
      halt_baddata();
    case 0x19:
      UINT_0011fce0._1_1_ = 0xf3;
      switchD_0011021c::switchdataD_0011fd58._0_1_ = 0xc6;
      halt_baddata();
    case 0x1a:
      UINT_0011fce0._1_1_ = 0xf3;
      switchD_0011021c::switchdataD_0011fd58._0_1_ = 0xc6;
      halt_baddata();
    case 0x1b:
      UINT_0011fce0._1_1_ = 0xf3;
      switchD_0011021c::switchdataD_0011fd58._0_1_ = 0xc6;
      halt_baddata();
    case 0x1c:
      UINT_0011fce0._1_1_ = 0xf3;
      switchD_0011021c::switchdataD_0011fd58._0_1_ = 0xc6;
      halt_baddata();
    case 0x1d:
      UINT_0011fce0._1_1_ = 0xf3;
      switchD_0011021c::switchdataD_0011fd58._0_1_ = 0xc6;
      halt_baddata();
    case 0x1e:
    case 0x21:
      UINT_0011fce0._1_1_ = 0xf3;
      switchD_0011021c::switchdataD_0011fd58._0_1_ = 0xc6;
      halt_baddata();
    case 0x1f:
      UINT_0011fce0._1_1_ = 0xf3;
      switchD_0011021c::switchdataD_0011fd58._0_1_ = 0xc6;
      halt_baddata();
    case 0x20:
      UINT_0011fce0._1_1_ = 0xf3;
      switchD_0011021c::switchdataD_0011fd58._0_1_ = 0xc6;
      halt_baddata();
    case 0x22:
      UINT_0011fce0._1_1_ = 0xf3;
      switchD_0011021c::switchdataD_0011fd58._0_1_ = 0xc6;
      halt_baddata();
    case 0x23:
    case 0x26:
      UINT_0011fce0._1_1_ = 0xf3;
      switchD_0011021c::switchdataD_0011fd58._0_1_ = 0xc6;
      halt_baddata();
    case 0x24:
      UINT_0011fce0._1_1_ = 0xf3;
      switchD_0011021c::switchdataD_0011fd58._0_1_ = 0xc6;
      halt_baddata();
    case 0x25:
      UINT_0011fce0._1_1_ = 0xf3;
      switchD_0011021c::switchdataD_0011fd58._0_1_ = 0xc6;
      halt_baddata();
    case 0x27:
      UINT_0011fce0._1_1_ = 0xf3;
      switchD_0011021c::switchdataD_0011fd58._0_1_ = 0xc6;
      halt_baddata();
    case 0x28:
    case 0x2b:
      UINT_0011fce0._1_1_ = 0xf3;
      switchD_0011021c::switchdataD_0011fd58._0_1_ = 0xc6;
      halt_baddata();
    case 0x29:
      UINT_0011fce0._1_1_ = 0xf3;
      switchD_0011021c::switchdataD_0011fd58._0_1_ = 0xc6;
      halt_baddata();
    case 0x2a:
      UINT_0011fce0._1_1_ = 0xf3;
      switchD_0011021c::switchdataD_0011fd58._0_1_ = 0xc6;
      halt_baddata();
    case 0x2c:
      UINT_0011fce0._1_1_ = 0xf3;
      switchD_0011021c::switchdataD_0011fd58._0_1_ = 0xc6;
      halt_baddata();
    case 0x2d:
      UINT_0011fce0._1_1_ = 0xf3;
      switchD_0011021c::switchdataD_0011fd58._0_1_ = 0xc6;
      halt_baddata();
    }
  case 0x15:
    puVar17 = &stack0xfffffffffffffff8;
    bVar14 = cstate->off_li;
    bVar21 = 0x10;
    bVar22 = 0x3f;
LAB_0011102e:
    *(compiler_state_t **)(puVar17 + -8) = unaff_R15;
    *(compiler_state_t **)(puVar17 + -0x10) = unaff_R15;
    *(undefined8 *)(puVar17 + -0x18) = 0x11103d;
    pbVar12 = gen_ncmp(cstate,OR_PACKET,bVar14,bVar21,bVar22,0x20,*(int *)(puVar17 + -0x10),
                       *(bpf_int32 *)(puVar17 + -8));
    *(undefined8 *)(puVar17 + -8) = 0x11104c;
    gen_and(pbVar12,(block *)pcVar9);
    return (block *)pcVar9;
  case 0x16:
    UINT_0011fce0._1_1_ = 0xf3;
    switchD_0011021c::switchdataD_0011fd58._0_1_ = 0xc6;
    halt_baddata();
  case 0x17:
    *(int *)cstate->top_ctx[0].__jmpbuf = (int)cstate->top_ctx[0].__jmpbuf[0] + -1;
    goto code_r0x0011113e;
  case 0x18:
    *(char *)pcVar9->top_ctx[0].__jmpbuf = (char)pcVar9->top_ctx[0].__jmpbuf[0] + cVar7;
    pcVar9 = (compiler_state_t *)(ulong)(reverse << 4);
    eaddr = (u_char *)0x0;
    in_R8D = (uint)in_R11;
    bVar21 = 0x10;
    goto code_r0x00111182;
  case 0x19:
    *(uint *)pcVar9->top_ctx[0].__jmpbuf = (int)pcVar9->top_ctx[0].__jmpbuf[0] + reverse;
    goto code_r0x0011110c;
  case 0x1a:
    UINT_0011fce0._1_1_ = 0xf3;
    switchD_0011021c::switchdataD_0011fd58._0_1_ = 0xc6;
    halt_baddata();
  case 0x1b:
    pcVar9 = (compiler_state_t *)(ulong)(reverse + *(int *)(in_R11 + -0x7bf00005));
code_r0x0011113e:
    bVar6 = (byte)pcVar9;
    switchD_0011021c::switchdataD_0011fd58._0_1_ = bVar6 - 0x3a;
    lVar5 = pcVar9->top_ctx[0].__jmpbuf[0];
    *(byte *)pcVar9->top_ctx[0].__jmpbuf = (char)pcVar9->top_ctx[0].__jmpbuf[0] + bVar6;
    if (!CARRY1((byte)lVar5,bVar6)) {
      bpf_error(cstate,"sio value %u too big; max value = 255",(ulong)pcVar9 & 0xffffffff);
    }
    eVar19 = OR_PACKET;
    bVar21 = 0x10;
    bVar14 = 0xffffffff;
LAB_001111e4:
    pbVar12 = gen_ncmp(cstate,eVar19,in_R8D,bVar21,bVar14,in_R9D,in_R10D,(bpf_int32)pcVar9);
    return pbVar12;
  case 0x1c:
    *(char *)cstate->top_ctx[0].__jmpbuf = (char)cstate->top_ctx[0].__jmpbuf[0] + 'X';
    *(uint *)(unaff_RBP + -0x3f000000) = *(uint *)(unaff_RBP + -0x3f000000) ^ 0xffffffe0;
    cVar7 = cVar7 + '1';
    pcVar9 = (compiler_state_t *)CONCAT71((int7)((ulong)pcVar9 >> 8),cVar7);
    *(char *)pcVar9->top_ctx[0].__jmpbuf = (char)pcVar9->top_ctx[0].__jmpbuf[0] + cVar7;
    *(char *)pcVar9->top_ctx[0].__jmpbuf = (char)pcVar9->top_ctx[0].__jmpbuf[0] + cVar7;
    in_R8D = bVar14;
code_r0x00111182:
    eVar19 = (e_offrel)eaddr;
    bVar14 = 0xf0;
    goto LAB_001111e4;
  case 0x1d:
    pcVar20 = (char *)((long)&cstate[0x1995].chunks[4].n_left + 7);
    cVar2 = *pcVar20;
    *pcVar20 = *pcVar20 + cVar7;
    if (!SCARRY1(cVar2,cVar7)) goto code_r0x0011110b;
code_r0x0011110c:
    pcVar20 = (char *)((long)&cstate[0x1995].chunks[2].m + 7);
    *pcVar20 = *pcVar20 + cVar7;
    if (*pcVar20 == '\0') {
      pcVar20 = (char *)((long)&UINT_0011fce4 + (long)(int)uVar3 + 1);
      *pcVar20 = *pcVar20 + 'X';
      pcVar9 = (compiler_state_t *)(ulong)(reverse | 0xec95);
    }
    else {
      *(char *)pcVar9->top_ctx[0].__jmpbuf = (char)pcVar9->top_ctx[0].__jmpbuf[0] + cVar7;
    }
code_r0x0011110b:
    *(char *)pcVar9->top_ctx[0].__jmpbuf = (char)pcVar9->top_ctx[0].__jmpbuf[0] + (char)pcVar9;
    pbVar12 = (block *)(*(code *)((long)&switchD_0011112e::switchdataD_0011fdb0 +
                                 (long)(int)(&switchD_0011112e::switchdataD_0011fdb0)[(long)eaddr]))
                                 (cstate,(code *)((long)&switchD_0011112e::switchdataD_0011fdb0 +
                                                 (long)(int)(&switchD_0011112e::switchdataD_0011fdb0
                                                            )[(long)eaddr]),
                                  (ulong)eaddr & 0xffffffff,(ulong)unaff_R15 & 0xffffffff,
                                  (ulong)cstate & 0xffffffff);
    return pbVar12;
  case 0x1e:
  case 0x21:
    psVar11 = gen_load_a(cstate,eVar19,bVar14,0x11fd58);
    pbVar12 = (block *)newchunk((compiler_state_t *)eaddr,0x120);
    (pbVar12->s).code = 0x25;
    pbVar12->head = pbVar12;
    pbVar12->stmts = psVar11;
    (pbVar12->s).k = (bpf_u_int32)cstate;
    pbVar12->sense = (uint)(pbVar12->sense == 0);
    return pbVar12;
  case 0x1f:
    pcVar9 = unaff_R15;
    goto code_r0x001123a4;
  case 0x20:
    pcVar9 = (compiler_state_t *)((ulong)cstate & 0xffffffff);
    unaff_R13D = unaff_EBX;
code_r0x001123a4:
    pbVar12 = gen_hostop(pcVar9,eVar19,(bpf_u_int32)cstate,2,(int)unaff_RBP,(u_int)unaff_R12,
                         unaff_R13D);
    gen_or((block *)unaff_R15,pbVar12);
    return pbVar12;
  case 0x22:
    *(char *)(unaff_RBP + -0x77) = *(char *)(unaff_RBP + -0x77) + cVar7;
    pcVar4 = (code *)swi(3);
    pbVar12 = (block *)(*pcVar4)();
    return pbVar12;
  case 0x23:
  case 0x26:
    unaff_R12 = cstate;
    goto LAB_00112452;
  case 0x24:
    if (4 < bVar14) {
      if (bVar14 != 0x18) {
        abort();
      }
      bpf_error(cstate,"ISO host filtering not implemented");
    }
    goto code_r0x00112496;
  case 0x25:
    bVar14 = reverse + (int)pcVar9->top_ctx[0].__jmpbuf[0];
    cRam0000000048e2874d = cRam0000000048e2874d + 'X';
code_r0x00112496:
    pbVar12 = (block *)(*(code *)((long)&switchD_0011249d::switchdataD_0011fde4 +
                                 (long)(int)(&switchD_0011249d::switchdataD_0011fde4)[bVar14]))();
    return pbVar12;
  case 0x27:
    pcVar9 = (compiler_state_t *)
             gen_ncmp(cstate,eVar19,bVar14,0x11fd58,in_R8D,in_R9D,unaff_EBX,unaff_R14D);
    cstate = pcVar9;
LAB_00112452:
    gen_and((block *)unaff_R12,(block *)pcVar9);
    return (block *)cstate;
  case 0x28:
  case 0x2b:
    pbVar12 = (block *)newchunk((compiler_state_t *)((ulong)cstate & 0xffffffff),(size_t)eaddr);
    (pbVar12->s).code = 0x15;
    pbVar12->head = pbVar12;
    pbVar12->stmts = (slist *)unaff_R12;
    (pbVar12->s).k = unaff_R13D;
    gen_and((block *)eaddr,pbVar12);
    gen_or(pbVar12,(block *)unaff_R15);
    cstate = in_stack_00000008;
  case 0x2c:
    gen_and((block *)cstate,(block *)unaff_R15);
    return (block *)unaff_R15;
  case 0x29:
    ppcVar18 = &pcStackY_40;
    pcStackY_40 = cstate;
  case 0x2a:
    *(compiler_state_t **)((long)ppcVar18 + -8) = pcVar9;
    *(code **)((long)ppcVar18 + -0x10) = gen_geneve_check;
    abort();
  case 0x2d:
    UINT_0011fce0._1_1_ = 0xf3;
    switchD_0011021c::switchdataD_0011fd58._0_1_ = 0xc6;
    halt_baddata();
  }
LAB_0011031e:
  bpf_error(cstate,pcVar20);
}

Assistant:

struct block *
gen_acode(compiler_state_t *cstate, const u_char *eaddr, struct qual q)
{
	switch (cstate->linktype) {

	case DLT_ARCNET:
	case DLT_ARCNET_LINUX:
		if ((q.addr == Q_HOST || q.addr == Q_DEFAULT) &&
		    q.proto == Q_LINK)
			return (gen_ahostop(cstate, eaddr, (int)q.dir));
		else {
			bpf_error(cstate, "ARCnet address used in non-arc expression");
			/* NOTREACHED */
		}
		break;

	default:
		bpf_error(cstate, "aid supported only on ARCnet");
		/* NOTREACHED */
	}
	bpf_error(cstate, "ARCnet address used in non-arc expression");
	/* NOTREACHED */
	return NULL;
}